

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_red.c
# Opt level: O2

void zzRedBarr(word *a,word *mod,size_t n,word *barr_param,void *stack)

{
  word *a_00;
  word *c;
  word wVar1;
  word wVar2;
  ulong uVar3;
  size_t sVar4;
  
  a_00 = (word *)((long)stack + n * 8 + 8);
  c = a_00 + n + 2;
  zzMul((word *)stack,a + (n - 1),n + 1,barr_param,n + 2,c + n * 2 + 2);
  zzMul(c,a_00,n + 2,mod,n,c + n * 2 + 2);
  zzSub2(a,c,n + 1);
  uVar3 = 1;
  for (sVar4 = 0; n != sVar4; sVar4 = sVar4 + 1) {
    if (mod[sVar4] != a[sVar4]) {
      uVar3 = 0;
    }
    uVar3 = uVar3 | mod[sVar4] < a[sVar4];
  }
  wVar2 = zzSubAndW(a,mod,n,-(uVar3 | a[n]));
  wVar1 = a[n];
  a[n] = wVar1 - wVar2;
  uVar3 = 1;
  for (sVar4 = 0; n != sVar4; sVar4 = sVar4 + 1) {
    if (mod[sVar4] != a[sVar4]) {
      uVar3 = 0;
    }
    uVar3 = uVar3 | mod[sVar4] < a[sVar4];
  }
  zzSubAndW(a,mod,n,-(uVar3 | wVar1 - wVar2));
  return;
}

Assistant:

void SAFE(zzRedBarr)(word a[], const word mod[], size_t n, 
	const word barr_param[], void* stack)
{
	register word w;
	size_t i;
	// переменные в stack
	word* q = (word*)stack;
	word* qm = q + (n + 1) + (n + 2);
	stack = qm + (n + 2) + n;
	// pre
	ASSERT(wwIsDisjoint2(a, 2 * n, mod, n));
	ASSERT(wwIsDisjoint2(a, 2 * n, barr_param, n + 2));
	ASSERT(n > 0 && mod[n - 1] != 0);
	// q <- (a \div B^{n - 1}) * barr_param
	zzMul(q, a + n - 1, n + 1, barr_param, n + 2, stack);
	// qm <- (q \div B^{n + 1}) * mod
	zzMul(qm, q + n + 1, n + 2, mod, n, stack);
	// a <- [n + 1]a - [n + 1]qm
	zzSub2(a, qm, n + 1);
	// a >= mod? => a -= mod
	for (i = 0, w = 1; i < n; ++i)
	{
		w &= wordEq01(mod[i], a[i]);
		w |= wordLess01(mod[i], a[i]);
	}
	w |= a[n], w = WORD_0 - w;
	a[n] -= zzSubAndW(a, mod, n, w);
	// a >= mod? => a -= mod
	for (i = 0, w = 1; i < n; ++i)
	{
		w &= wordEq01(mod[i], a[i]);
		w |= wordLess01(mod[i], a[i]);
	}
	w |= a[n], w = WORD_0 - w;
	zzSubAndW(a, mod, n, w);
	// очистка
	w = 0;
}